

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

CharItem * __thiscall
Hpipe::Pool<Hpipe::CharItem,_32>::New<Hpipe::Cond>(Pool<Hpipe::CharItem,_32> *this,Cond *args)

{
  int iVar1;
  CharItem *this_00;
  Cond local_40;
  Set *local_20;
  Set *n;
  Cond *args_local;
  Pool<Hpipe::CharItem,_32> *this_local;
  
  n = (Set *)args;
  args_local = (Cond *)this;
  if (this->used == 0x20) {
    local_20 = (Set *)operator_new(0x1108);
    local_20->prev = this->last;
    this->last = local_20;
    this->used = 0;
  }
  iVar1 = this->used;
  this->used = iVar1 + 1;
  this_00 = (CharItem *)(this->last->items + (long)iVar1 * 0x88);
  Cond::Cond(&local_40,(Cond *)n);
  CharItem::CharItem(this_00,&local_40);
  return this_00;
}

Assistant:

T *New( Args&&... args ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        return new ( last->items + sizeof( T ) * used++ ) T( std::forward<Args>( args )... );
    }